

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_type_info.hpp
# Opt level: O1

string * __thiscall
duckdb::LogicalTypeModifier::ToString_abi_cxx11_
          (string *__return_storage_ptr__,LogicalTypeModifier *this)

{
  size_type sVar1;
  pointer pcVar2;
  
  sVar1 = (this->label)._M_string_length;
  if (sVar1 == 0) {
    Value::ToString_abi_cxx11_((string *)__return_storage_ptr__,&this->value);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (this->label)._M_dataplus._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string ToString() const {
		return label.empty() ? value.ToString() : label;
	}